

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  float fVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  float fVar6;
  float fVar7;
  ImVec2 pos;
  ImVec2 local_10;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->MovingWindow;
  if (pIVar4 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar3 = GImGui->ActiveId;
    if (GImGui->ActiveIdWindow->MoveId != IVar3) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar3;
    if (pIVar5->ActiveIdPreviousFrame == IVar3) {
      pIVar5->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar5->IO).MouseDown[0] != false) {
      return;
    }
    pIVar5->ActiveIdIsJustActivated = IVar3 != 0;
    if (IVar3 != 0) {
      pIVar5->ActiveIdTimer = 0.0;
      pIVar5->ActiveIdHasBeenEdited = false;
    }
    pIVar5->ActiveId = 0;
    pIVar5->ActiveIdAllowNavDirFlags = 0;
    pIVar5->ActiveIdAllowOverlap = false;
    pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar3 = GImGui->ActiveId;
  pIVar1 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = IVar3;
  if (*pIVar1 == IVar3) {
    pIVar5->ActiveIdPreviousFrameIsAlive = true;
  }
  if ((((pIVar5->IO).MouseDown[0] != true) || (fVar6 = (pIVar5->IO).MousePos.x, fVar6 < -256000.0))
     || ((pIVar5->IO).MousePos.y < -256000.0)) {
    pIVar5->ActiveIdIsJustActivated = IVar3 != 0;
    if (IVar3 != 0) {
      pIVar5->ActiveIdTimer = 0.0;
      pIVar5->ActiveIdHasBeenEdited = false;
    }
    pIVar5->ActiveId = 0;
    pIVar5->ActiveIdAllowNavDirFlags = 0;
    pIVar5->ActiveIdAllowOverlap = false;
    pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar5->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  pIVar4 = pIVar4->RootWindow;
  fVar6 = fVar6 - (pIVar5->ActiveIdClickOffset).x;
  fVar7 = (pIVar5->IO).MousePos.y - (pIVar5->ActiveIdClickOffset).y;
  local_10.y = fVar7;
  local_10.x = fVar6;
  fVar2 = (pIVar4->Pos).x;
  if ((fVar2 == fVar6) && (!NAN(fVar2) && !NAN(fVar6))) {
    fVar6 = (pIVar4->Pos).y;
    if ((fVar6 == fVar7) && (!NAN(fVar6) && !NAN(fVar7))) goto LAB_001218d1;
  }
  if (((pIVar4->Flags & 0x100) == 0) && (pIVar5->SettingsDirtyTimer <= 0.0)) {
    pIVar5->SettingsDirtyTimer = (pIVar5->IO).IniSavingRate;
  }
  ::SetWindowPos(pIVar4,&local_10,1);
LAB_001218d1:
  FocusWindow(pIVar5->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}